

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> * __thiscall
AssemblyCode::CJumpNotEqualCommand::GetIn
          (vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__return_storage_ptr__,
          CJumpNotEqualCommand *this)

{
  initializer_list<IRT::CTemp> __l;
  CTemp *local_a8;
  allocator<IRT::CTemp> local_7d [13];
  CTemp *local_70;
  CTemp local_68;
  CTemp local_48;
  iterator local_28;
  size_type local_20;
  CJumpNotEqualCommand *local_18;
  CJumpNotEqualCommand *this_local;
  
  local_70 = &local_68;
  local_18 = this;
  this_local = (CJumpNotEqualCommand *)__return_storage_ptr__;
  IRT::CTemp::CTemp(local_70,&this->leftOperand);
  local_70 = &local_48;
  IRT::CTemp::CTemp(local_70,&this->rightOperand);
  local_28 = &local_68;
  local_20 = 2;
  std::allocator<IRT::CTemp>::allocator(local_7d);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::vector(__return_storage_ptr__,__l,local_7d);
  std::allocator<IRT::CTemp>::~allocator(local_7d);
  local_a8 = (CTemp *)&local_28;
  do {
    local_a8 = local_a8 + -1;
    IRT::CTemp::~CTemp(local_a8);
  } while (local_a8 != &local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IRT::CTemp> AssemblyCode::CJumpNotEqualCommand::GetIn( ) const {
    return { leftOperand, rightOperand };
}